

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

lyd_node * lyd_child_no_keys(lyd_node *node)

{
  lyd_node *plVar1;
  lyd_node **pplVar2;
  
  if (node == (lyd_node *)0x0) {
    return (lyd_node *)0x0;
  }
  if (node->schema == (lysc_node *)0x0) {
    return *(lyd_node **)(node + 1);
  }
  pplVar2 = lyd_node_child_p(node);
  if (pplVar2 != (lyd_node **)0x0) {
    while (plVar1 = *pplVar2, plVar1 != (lyd_node *)0x0) {
      if (plVar1->schema == (lysc_node *)0x0) {
        return plVar1;
      }
      if ((plVar1->schema->flags & 0x100) == 0) {
        return plVar1;
      }
      pplVar2 = &plVar1->next;
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_child_no_keys(const struct lyd_node *node)
{
    struct lyd_node **children;

    if (!node) {
        return NULL;
    }

    if (!node->schema) {
        /* opaq node */
        return ((struct lyd_node_opaq *)node)->child;
    }

    children = lyd_node_child_p((struct lyd_node *)node);
    if (children) {
        struct lyd_node *child = *children;

        while (child && child->schema && (child->schema->flags & LYS_KEY)) {
            child = child->next;
        }
        return child;
    } else {
        return NULL;
    }
}